

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Error FT_Stream_New(FT_Library library,FT_Open_Args *args,FT_Stream *astream)

{
  FT_Memory memory_00;
  FT_Stream local_40;
  FT_Stream stream;
  FT_Memory memory;
  FT_Stream *ppFStack_28;
  FT_Error error;
  FT_Stream *astream_local;
  FT_Open_Args *args_local;
  FT_Library library_local;
  
  *astream = (FT_Stream)0x0;
  if (library == (FT_Library)0x0) {
    library_local._4_4_ = 0x21;
  }
  else if (args == (FT_Open_Args *)0x0) {
    library_local._4_4_ = 6;
  }
  else {
    memory_00 = library->memory;
    ppFStack_28 = astream;
    astream_local = (FT_Stream *)args;
    args_local = (FT_Open_Args *)library;
    local_40 = (FT_Stream)ft_mem_alloc(memory_00,0x50,(FT_Error *)((long)&memory + 4));
    if (memory._4_4_ == 0) {
      local_40->memory = memory_00;
      if (((ulong)*astream_local & 1) == 0) {
        if (((ulong)*astream_local & 4) == 0) {
          if ((((ulong)*astream_local & 2) == 0) || (astream_local[4] == (FT_Stream)0x0)) {
            memory._4_4_ = 6;
          }
          else {
            ft_mem_free(memory_00,local_40);
            local_40 = astream_local[4];
          }
        }
        else {
          memory._4_4_ = FT_Stream_Open(local_40,(char *)astream_local[3]);
          local_40->pathname = *(FT_StreamDesc *)(astream_local + 3);
        }
      }
      else {
        FT_Stream_OpenMemory(local_40,(FT_Byte *)astream_local[1],(FT_ULong)astream_local[2]);
      }
      if (memory._4_4_ == 0) {
        local_40->memory = memory_00;
      }
      else {
        ft_mem_free(memory_00,local_40);
        local_40 = (FT_Stream)0x0;
      }
      *ppFStack_28 = local_40;
    }
    library_local._4_4_ = memory._4_4_;
  }
  return library_local._4_4_;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_Stream_New( FT_Library           library,
                 const FT_Open_Args*  args,
                 FT_Stream           *astream )
  {
    FT_Error   error;
    FT_Memory  memory;
    FT_Stream  stream = NULL;


    *astream = NULL;

    if ( !library )
      return FT_THROW( Invalid_Library_Handle );

    if ( !args )
      return FT_THROW( Invalid_Argument );

    memory = library->memory;

    if ( FT_NEW( stream ) )
      goto Exit;

    stream->memory = memory;

    if ( args->flags & FT_OPEN_MEMORY )
    {
      /* create a memory-based stream */
      FT_Stream_OpenMemory( stream,
                            (const FT_Byte*)args->memory_base,
                            (FT_ULong)args->memory_size );
    }

#ifndef FT_CONFIG_OPTION_DISABLE_STREAM_SUPPORT

    else if ( args->flags & FT_OPEN_PATHNAME )
    {
      /* create a normal system stream */
      error = FT_Stream_Open( stream, args->pathname );
      stream->pathname.pointer = args->pathname;
    }
    else if ( ( args->flags & FT_OPEN_STREAM ) && args->stream )
    {
      /* use an existing, user-provided stream */

      /* in this case, we do not need to allocate a new stream object */
      /* since the caller is responsible for closing it himself       */
      FT_FREE( stream );
      stream = args->stream;
    }

#endif

    else
      error = FT_THROW( Invalid_Argument );

    if ( error )
      FT_FREE( stream );
    else
      stream->memory = memory;  /* just to be certain */

    *astream = stream;

  Exit:
    return error;
  }